

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_method.cc
# Opt level: O2

bool __thiscall
bssl::tls_set_read_state
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,UniquePtr<SSLAEADContext> *aead_ctx,
          Span<const_unsigned_char> traffic_secret)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  
  bVar1 = tls_has_unprocessed_handshake_data((SSL *)this);
  if (bVar1) {
    bVar1 = false;
    ERR_put_error(0x10,0,0xff,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls_method.cc"
                  ,0x30);
    ssl_send_alert((SSL *)this,2,10);
  }
  else {
    iVar2 = SSL_is_quic((SSL *)this);
    puVar3 = *(undefined8 **)(this + 0x30);
    if (iVar2 != 0) {
      if (((puVar3[0x23] == 0) || ((*(byte *)(puVar3[0x23] + 0x6ca) & 0x10) == 0)) &&
         (iVar2 = (*(code *)**(undefined8 **)(this + 0x98))
                            (this,(ulong)ssl & 0xffffffff,
                             ((((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                               CONCAT44(in_register_00000014,level))->_M_t).
                              super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->
                             cipher_,aead_ctx,traffic_secret.data_), iVar2 == 0)) {
        return false;
      }
      if ((int)ssl == 1) {
        return true;
      }
      puVar3 = *(undefined8 **)(this + 0x30);
      *(int *)(puVar3 + 0x19) = (int)ssl;
    }
    *puVar3 = 0;
    std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator=
              ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)(puVar3 + 0x21),
               (__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
               CONCAT44(in_register_00000014,level));
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static bool tls_set_read_state(SSL *ssl, ssl_encryption_level_t level,
                               UniquePtr<SSLAEADContext> aead_ctx,
                               Span<const uint8_t> traffic_secret) {
  // Cipher changes are forbidden if the current epoch has leftover data.
  if (tls_has_unprocessed_handshake_data(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    return false;
  }

  if (SSL_is_quic(ssl)) {
    if ((ssl->s3->hs == nullptr || !ssl->s3->hs->hints_requested) &&
        !ssl->quic_method->set_read_secret(ssl, level, aead_ctx->cipher(),
                                           traffic_secret.data(),
                                           traffic_secret.size())) {
      return false;
    }

    // QUIC only uses |ssl| for handshake messages, which never use early data
    // keys, so we return without installing anything. This avoids needing to
    // have two secrets active at once in 0-RTT.
    if (level == ssl_encryption_early_data) {
      return true;
    }
    ssl->s3->quic_read_level = level;
  }

  ssl->s3->read_sequence = 0;
  ssl->s3->aead_read_ctx = std::move(aead_ctx);
  return true;
}